

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O3

void __thiscall hwtest::pgraph::MthdCelsiusStencilFunc::emulate_mthd(MthdCelsiusStencilFunc *this)

{
  pgraph_state *state;
  uint uVar1;
  uint err;
  
  state = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp;
  pgraph_celsius_pre_icmd(state);
  uVar1 = (this->super_SingleMthdTest).super_MthdTest.val;
  err = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_config_c >> 6 & 4 |
        (uint)((uVar1 & 0xfffffff8) != 0x200);
  if (err != 0) {
    MthdTest::warn((MthdTest *)this,err);
    return;
  }
  if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource & 2) == 0) {
    uVar1 = (uVar1 & 0xf) << 4 |
            (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_stencil_a &
            0xffffff0f;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_stencil_a = uVar1;
    pgraph_celsius_icmd(state,0x1d,uVar1,true);
    return;
  }
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_celsius_pre_icmd(&exp);
		uint32_t err = 0;
		if (val >= 0x200 && val < 0x208) {
		} else {
			err |= 1;
		}
		if (extr(exp.celsius_config_c, 8, 1))
			err |= 4;
		if (err) {
			warn(err);
		} else {
			if (!extr(exp.nsource, 1, 1)) {
				insrt(exp.bundle_stencil_a, 4, 4, val);
				pgraph_celsius_icmd(&exp, 0x1d, exp.bundle_stencil_a, true);
			}
		}
	}